

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O1

mbedtls_cipher_info_t * __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GetCipher(AESStateMBEDTLS *this,size_t key_len)

{
  mbedtls_cipher_info_t *pmVar1;
  InternalException *this_00;
  runtime_error *this_01;
  mbedtls_cipher_type_t cipher_type;
  string local_40;
  
  if (this->cipher == CTR) {
    if (key_len == 0x10) {
      cipher_type = MBEDTLS_CIPHER_AES_128_CTR;
    }
    else if (key_len == 0x20) {
      cipher_type = MBEDTLS_CIPHER_AES_256_CTR;
    }
    else {
      if (key_len != 0x18) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid AES key length");
        goto LAB_01d2b4be;
      }
      cipher_type = MBEDTLS_CIPHER_AES_192_CTR;
    }
  }
  else {
    if (this->cipher != GCM) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid Encryption/Decryption Cipher: %d","");
      duckdb::InternalException::InternalException<int>(this_00,&local_40,this->cipher);
      __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (key_len == 0x10) {
      cipher_type = MBEDTLS_CIPHER_AES_128_GCM;
    }
    else if (key_len == 0x20) {
      cipher_type = MBEDTLS_CIPHER_AES_256_GCM;
    }
    else {
      if (key_len != 0x18) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Invalid AES key length");
LAB_01d2b4be:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cipher_type = MBEDTLS_CIPHER_AES_192_GCM;
    }
  }
  pmVar1 = mbedtls_cipher_info_from_type(cipher_type);
  return pmVar1;
}

Assistant:

const mbedtls_cipher_info_t *MbedTlsWrapper::AESStateMBEDTLS::GetCipher(size_t key_len){

	switch(cipher){
		case GCM:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_GCM);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_GCM);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_GCM);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		case CTR:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_CTR);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_CTR);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_CTR);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		default:
			throw duckdb::InternalException("Invalid Encryption/Decryption Cipher: %d", static_cast<int>(cipher));
	}
}